

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SourceLineInfo * __thiscall Catch::AssertionResult::getSourceInfo(AssertionResult *this)

{
  SourceLineInfo *in_RSI;
  SourceLineInfo *in_RDI;
  
  SourceLineInfo::SourceLineInfo(in_RSI,in_RDI);
  return in_RDI;
}

Assistant:

SourceLineInfo AssertionResult::getSourceInfo() const {
        return m_info.lineInfo;
    }